

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool ScanNumber(ConfigScanner *sc)

{
  char *__src;
  bool bVar1;
  int iVar2;
  size_t __n;
  char *__dest;
  long in_RDI;
  double dVar3;
  char *temp;
  size_t length;
  _Bool point;
  char ch;
  char *start;
  char local_19;
  _Bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    __src = *(char **)(in_RDI + 0x18);
    local_19 = **(char **)(in_RDI + 0x18);
    if ((local_19 == '+') || (local_19 == '-')) {
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
      local_19 = **(char **)(in_RDI + 0x18);
    }
    bVar1 = false;
    if (('/' < local_19) && (local_19 < ':')) {
      while( true ) {
        while (local_19 == '.') {
          if (bVar1) {
            return false;
          }
          bVar1 = true;
          *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
          local_19 = **(char **)(in_RDI + 0x18);
        }
        if ((local_19 < '0') || ('9' < local_19)) break;
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
        local_19 = **(char **)(in_RDI + 0x18);
      }
    }
    __n = *(long *)(in_RDI + 0x18) - (long)__src;
    __dest = (char *)malloc(__n + 1);
    memset(__dest,0,__n + 1);
    strncpy(__dest,__src,__n);
    if (bVar1) {
      dVar3 = atof(__dest);
      *(double *)(in_RDI + 0x68) = dVar3;
      *(undefined4 *)(in_RDI + 0x38) = 4;
    }
    else {
      iVar2 = atoi(__dest);
      *(long *)(in_RDI + 0x60) = (long)iVar2;
      *(undefined4 *)(in_RDI + 0x38) = 3;
    }
    free(__dest);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ScanNumber(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char *start = sc->ptr;
	char ch = *sc->ptr;
	if (ch == '+' || ch == '-')
	{
		sc->ptr++;
		ch = *sc->ptr;
	}
	bool point = false;
	if (ch >= '0' && ch <= '9')
	{
		while (true)
		{
			if (ch == '.')
			{
				if (point)
				{
					return false;
				}
				else
				{
					point = true;
				}
				sc->ptr++;
				ch = *sc->ptr;
			}
			else if (ch >= '0' && ch <= '9')
			{
				sc->ptr++;
				ch = *sc->ptr;
			}
			else
			{
				break;
			}
		}
	}
	size_t length = sc->ptr - start;
	char *temp = (char *)malloc(length + 1);
	memset(temp, 0, length + 1);
	strncpy(temp, start, length);
	if (point)
	{
		sc->current_double = atof(temp);
		sc->vtype = VTYPE_DOUBLE;
	}
	else
	{
		sc->current_integer = atoi(temp);
		sc->vtype = VTYPE_INTEGER;
	}
	free(temp);
	return true;
}